

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<capnp::Schema>::setCapacity(Vector<capnp::Schema> *this,size_t newSize)

{
  Schema *pSVar1;
  Schema *__dest;
  size_t __n;
  ArrayBuilder<capnp::Schema> local_38;
  
  pSVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pSVar1 >> 3)) {
    (this->builder).pos = pSVar1 + newSize;
  }
  __dest = _::HeapArrayDisposer::allocateUninitialized<capnp::Schema>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pSVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pSVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::Schema> *)((long)__dest + __n);
  ArrayBuilder<capnp::Schema>::operator=(&this->builder,&local_38);
  ArrayBuilder<capnp::Schema>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }